

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

void __thiscall
brynet::net::TcpService::postSessionAsyncProc
          (TcpService *this,SESSION_TYPE id,function<void_(brynet::net::DataSocket_*)> *callback)

{
  _Manager_type p_Var1;
  EventLoop *this_00;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<brynet::net::IOLoopData> ioLoopData;
  type callbackCapture;
  shared_ptr<const_brynet::net::TcpService> shared_this;
  _Any_data local_a0;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  undefined1 local_80 [24];
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  __shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  getIOLoopDataBySocketID((TcpService *)&ioLoopData,(SESSION_TYPE)this);
  peVar2 = ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    callbackCapture.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    callbackCapture.super__Function_base._M_functor._8_8_ = 0;
    callbackCapture.super__Function_base._M_manager = (_Manager_type)0x0;
    callbackCapture._M_invoker = callback->_M_invoker;
    p_Var1 = (callback->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      callbackCapture.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
      callbackCapture.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
      (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
      callback->_M_invoker = (_Invoker_type)0x0;
      callbackCapture.super__Function_base._M_manager = p_Var1;
    }
    std::__shared_ptr<brynet::net::TcpService_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<brynet::net::TcpService,void>
              ((__shared_ptr<brynet::net::TcpService_const,(__gnu_cxx::_Lock_policy)2> *)
               &shared_this,
               (__weak_ptr<brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<brynet::net::TcpService>);
    local_38._M_ptr =
         ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._M_refcount._M_pi =
         ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (peVar2->mEventLoop).
              super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::function<void_(brynet::net::DataSocket_*)>::function
              ((function<void_(brynet::net::DataSocket_*)> *)&local_a0,&callbackCapture);
    local_80._0_8_ = id;
    std::__shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2> *)
               (local_80 + 8),
               &shared_this.
                super___shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,&local_38);
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x48);
    _Var5._M_pi = local_68._M_refcount._M_pi;
    peVar2 = local_68._M_ptr;
    uVar4 = local_80._16_8_;
    uVar3 = local_80._8_8_;
    *(undefined8 *)local_58._M_unused._0_8_ = 0;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x18) =
         _Stack_88._M_pi;
    if (local_90 != (element_type *)0x0) {
      *(void **)local_58._M_unused._0_8_ = local_a0._M_unused._M_object;
      *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_a0._8_8_;
      *(element_type **)((long)local_58._M_unused._0_8_ + 0x10) = local_90;
      local_90 = (element_type *)0x0;
      _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    local_80._16_8_ = 0;
    local_80._8_8_ = 0;
    local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x20) = local_80._0_8_;
    local_68._M_ptr = (element_type *)0x0;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x28) = uVar3;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x30) = uVar4;
    *(element_type **)((long)local_58._M_unused._0_8_ + 0x38) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_58._M_unused._0_8_ + 0x40) =
         _Var5._M_pi;
    pcStack_40 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:140:30)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:140:30)>
               ::_M_manager;
    EventLoop::pushAsyncProc(this_00,(USER_PROC *)&local_58);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    postSessionAsyncProc(long,std::function<void(brynet::net::DataSocket*)>)::~__0
              ((postSessionAsyncProc_long_std__function<void(brynet::net::DataSocket*)>_ *)
               local_a0._M_pod_data);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&shared_this.
                super___shared_ptr<const_brynet::net::TcpService,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::_Function_base::~_Function_base(&callbackCapture.super__Function_base);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ioLoopData.super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void TcpService::postSessionAsyncProc(SESSION_TYPE id, 
    std::function<void(DataSocket::PTR)> callback) const
{
    union  SessionId sid;
    sid.id = id;
    auto ioLoopData = getIOLoopDataBySocketID(id);
    if (ioLoopData == nullptr)
    {
        return;
    }

    const auto& eventLoop = ioLoopData->getEventLoop();
    auto callbackCapture = std::move(callback);
    auto shared_this = shared_from_this();
    auto ioLoopDataCapture = std::move(ioLoopData);
    eventLoop->pushAsyncProc([callbackCapture, 
        sid, 
        shared_this, 
        ioLoopDataCapture](){
        DataSocket::PTR tmp = nullptr;
        if (callbackCapture != nullptr &&
            ioLoopDataCapture->getDataSockets().get(sid.data.index, tmp) &&
            tmp != nullptr)
        {
            const auto ud = brynet::net::cast<SESSION_TYPE>(tmp->getUD());
            if (ud != nullptr && *ud == sid.id)
            {
                callbackCapture(tmp);
            }
        }
    });
}